

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdoc.c
# Opt level: O0

void SetUTF8(TidyDocImpl *doc)

{
  Node *element;
  Node *node_00;
  Node *node;
  Node *head;
  TidyDocImpl *doc_local;
  
  element = prvTidyFindHEAD(doc);
  if (element != (Node *)0x0) {
    node_00 = prvTidyInferredTag(doc,TidyTag_META);
    prvTidyAddAttribute(doc,node_00,"http-equiv","Content-Type");
    prvTidyAddAttribute(doc,node_00,"content","text/html; charset=UTF-8");
    prvTidyInsertNodeAtStart(element,node_00);
  }
  return;
}

Assistant:

static void SetUTF8( TidyDocImpl* doc )
{
    Node *head = TY_(FindHEAD)( doc );

    if (head)
    {
        Node *node = TY_(InferredTag)(doc, TidyTag_META);
        TY_(AddAttribute)( doc, node, "http-equiv", "Content-Type" );
        TY_(AddAttribute)( doc, node, "content", "text/html; charset=UTF-8" );
        TY_(InsertNodeAtStart)( head, node );
    }
}